

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalPtr.hpp
# Opt level: O1

int * __thiscall BCL::GlobalPtr<int>::local(GlobalPtr<int> *this)

{
  debug_error *this_00;
  string local_40;
  
  if (this->rank == my_rank) {
    return (int *)(smem_base_ptr + this->ptr);
  }
  this_00 = (debug_error *)__cxa_allocate_exception(0x40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"calling local() on a remote GlobalPtr\n","");
  debug_error::debug_error(this_00,&local_40);
  __cxa_throw(this_00,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

T *local() const {
    if (rank != BCL::rank()) {
      BCL_DEBUG(throw debug_error("calling local() on a remote GlobalPtr\n"));
      return nullptr;
    } else {
      return (T *) (((char *) BCL::smem_base_ptr) + ptr);
    }
  }